

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O2

JavascriptArray * __thiscall
JsrtDebugStackFrames::StackFrames(JsrtDebugStackFrames *this,ScriptContext *scriptContext)

{
  uint32 length;
  ThreadContext *pTVar1;
  ScriptContext *this_00;
  DiagStackFrame *this_01;
  code *pcVar2;
  bool bVar3;
  BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  ArenaAllocator *pAVar4;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_03;
  DebugContext *pDVar5;
  JavascriptArray *pJVar6;
  Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *this_04;
  DiagStackFrame **ppDVar7;
  undefined4 *puVar8;
  DynamicObject *value;
  Var newValue;
  int i;
  int stepsBack;
  long lVar9;
  int iVar10;
  ScriptContext **ppSVar11;
  DiagStackFrame *local_58;
  DiagStackFrame *stackFrame;
  void *local_48;
  ScriptContext *local_40;
  JavascriptArray *local_38;
  
  pTVar1 = scriptContext->threadContext;
  local_48 = pTVar1->debugManager->dispatchHaltFrameAddress;
  local_40 = scriptContext;
  if (local_48 != (void *)0x0) {
    if (this->framesDictionary == (FramesDictionary *)0x0) {
      pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      this_02 = (BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::ArenaAllocator>(0x38,pAVar4,0x35916e);
      pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
      JsUtil::
      BaseDictionary<unsigned_int,_JsrtDebuggerStackFrame_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pAVar4,10);
      this->framesDictionary = this_02;
    }
    else {
      ClearFrameDictionary(this);
    }
    pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    this_03 = (List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)new<Memory::ArenaAllocator>(0x30,pAVar4,0x35916e);
    stackFrame = (DiagStackFrame *)this;
    pAVar4 = JsrtDebugManager::GetDebugObjectArena(this->jsrtDebugManager);
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar4;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_0136cf38;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (this_03->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    this_03->length = 0;
    this_03->increment = 10;
    ppSVar11 = &pTVar1->scriptContextList;
    while (this_00 = *ppSVar11, this_00 != (ScriptContext *)0x0) {
      bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this_00);
      if (!bVar3) break;
      pDVar5 = Js::ScriptContext::GetDebugContext(this_00);
      pJVar6 = (JavascriptArray *)
               Js::ProbeContainer::GetFramePointers(pDVar5->diagProbesContainer,(DWORD_PTR)local_48)
      ;
      if (pJVar6 != (JavascriptArray *)0x0) {
        local_38 = pJVar6;
        this_04 = Memory::
                  WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                  ::GetStrongReference
                            ((WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                              *)pJVar6);
        if (this_04 !=
            (Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)0x0) {
          iVar10 = (this_04->list).
                   super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                   .count;
          stepsBack = 0;
          if (iVar10 < 1) {
            iVar10 = 0;
            stepsBack = 0;
          }
          for (; iVar10 != stepsBack; stepsBack = stepsBack + 1) {
            ppDVar7 = JsUtil::
                      Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
                      Peek(this_04,stepsBack);
            local_58 = *ppDVar7;
            JsUtil::
            List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::Add(this_03,&local_58);
          }
        }
        pJVar6 = local_38;
        Memory::
        WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
        ::ReleaseStrongReference
                  ((WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                    *)local_38);
        Memory::
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame*,Memory::ArenaAllocator,false,DefaultComparer>>>
                  (&Memory::HeapAllocator::Instance,
                   (WeakArenaReference<JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>_>
                    *)pJVar6);
      }
      ppSVar11 = &this_00->next;
    }
    JsUtil::
    List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Sort(this_03,DiagStackFrameSorter,local_48);
    length = (this_03->
             super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
             count;
    pJVar6 = Js::JavascriptLibrary::CreateArray
                       ((local_40->super_ScriptContextBase).javascriptLibrary,length,length);
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    lVar9 = 0;
    local_38 = pJVar6;
    do {
      if ((this_03->
          super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
          <= lVar9) {
        pAVar4 = JsrtDebugManager::GetDebugObjectArena
                           ((JsrtDebugManager *)stackFrame->_vptr_DiagStackFrame);
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::List<Js::DiagStackFrame*,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                  (pAVar4,this_03);
        return pJVar6;
      }
      this_01 = (this_03->
                super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
                buffer[lVar9];
      if (lVar9 == 0) {
        bVar3 = Js::DiagStackFrame::IsTopFrame(this_01);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                             ,0x399,"(index != 0 || stackFrame->IsTopFrame())",
                             "Index 0 frame is not marked as top frame");
          if (!bVar3) goto LAB_0039c885;
          *puVar8 = 0;
          pJVar6 = local_38;
        }
      }
      value = GetStackFrame((JsrtDebugStackFrames *)stackFrame,this_01,(uint)lVar9);
      newValue = Js::CrossSite::MarshalVar(local_40,value,false);
      Js::JavascriptArray::DirectSetItemAt<void*>(pJVar6,(uint)lVar9,newValue);
      lVar9 = lVar9 + 1;
    } while( true );
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  *puVar8 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDebuggerObject.cpp"
                     ,0x36a,"(dispatchHaltFrameAddress > 0)",
                     "Didn\'t set the dispatchHaltFrameAddress at time of break?");
  if (bVar3) {
    *puVar8 = 0;
    pJVar6 = Js::JavascriptLibrary::CreateArray
                       ((local_40->super_ScriptContextBase).javascriptLibrary,0,0);
    return pJVar6;
  }
LAB_0039c885:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

Js::JavascriptArray * JsrtDebugStackFrames::StackFrames(Js::ScriptContext * scriptContext)
{
    Js::JavascriptArray* stackTraceArray = nullptr;

    ThreadContext* threadContext = scriptContext->GetThreadContext();

    DWORD_PTR dispatchHaltFrameAddress = threadContext->GetDebugManager()->GetDispatchHaltFrameAddress();
    AssertMsg(dispatchHaltFrameAddress > 0, "Didn't set the dispatchHaltFrameAddress at time of break?");

    if (dispatchHaltFrameAddress != 0)
    {
        if (this->framesDictionary == nullptr)
        {
            this->framesDictionary = Anew(this->jsrtDebugManager->GetDebugObjectArena(), FramesDictionary, this->jsrtDebugManager->GetDebugObjectArena(), 10);
        }
        else
        {
            this->ClearFrameDictionary();
        }

        typedef JsUtil::List<Js::DiagStackFrame*, ArenaAllocator> DiagStackFrameList;
        DiagStackFrameList* stackList = Anew(this->jsrtDebugManager->GetDebugObjectArena(), DiagStackFrameList, this->jsrtDebugManager->GetDebugObjectArena(), 10);

        // Walk all the script contexts and collect the frames which are below the address when break was reported.
        for (Js::ScriptContext *tempScriptContext = threadContext->GetScriptContextList();
        tempScriptContext != nullptr && tempScriptContext->IsScriptContextInDebugMode();
            tempScriptContext = tempScriptContext->next)
        {
            Js::WeakDiagStack * framePointers = tempScriptContext->GetDebugContext()->GetProbeContainer()->GetFramePointers(dispatchHaltFrameAddress);
            if (framePointers != nullptr)
            {
                Js::DiagStack* stackFrames = framePointers->GetStrongReference();
                if (stackFrames != nullptr)
                {
                    int count = stackFrames->Count();
                    for (int frameIndex = 0; frameIndex < count; ++frameIndex)
                    {
                        Js::DiagStackFrame* stackFrame = stackFrames->Peek(frameIndex);
                        stackList->Add(stackFrame);
                    }
                }

                framePointers->ReleaseStrongReference();
                HeapDelete(framePointers);
            }
        }

        // Frames can be from multiple contexts, sort them based on stack address
        stackList->Sort(DiagStackFrameSorter, (void*)dispatchHaltFrameAddress);

        stackTraceArray = scriptContext->GetLibrary()->CreateArray(stackList->Count(), stackList->Count());

        stackList->Map([&](int index, Js::DiagStackFrame* stackFrame)
        {
            AssertMsg(index != 0 || stackFrame->IsTopFrame(), "Index 0 frame is not marked as top frame");
            Js::DynamicObject* stackTraceObject = this->GetStackFrame(stackFrame, index);
            Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, stackTraceObject);
            stackTraceArray->DirectSetItemAt(index, marshaledObj);
        });

        Adelete(this->jsrtDebugManager->GetDebugObjectArena(), stackList);
    }
    else
    {
        // Empty array
        stackTraceArray = scriptContext->GetLibrary()->CreateArray(0, 0);
    }

    return stackTraceArray;
}